

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec_extras.h
# Opt level: O0

void Cross<double>(TPZVec<double> *x1,TPZVec<double> *x2,TPZVec<double> *result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  
  pdVar5 = TPZVec<double>::operator[](in_RDI,1);
  dVar1 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RSI,2);
  dVar2 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RSI,1);
  dVar3 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RDI,2);
  dVar4 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RDX,0);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RSI,0);
  dVar2 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RSI,2);
  dVar3 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RDI,0);
  dVar4 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RDX,1);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RSI,1);
  dVar2 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RSI,0);
  dVar3 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RDI,1);
  dVar4 = *pdVar5;
  pdVar5 = TPZVec<double>::operator[](in_RDX,2);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  return;
}

Assistant:

void Cross(const TPZVec <T> &x1, const TPZVec<T> &x2, TPZVec<T> &result) {
#ifdef PZDEBUG
    if (x1.size() != 3) {
        DebugStop();
    }
    if (x2.size() != 3) {
        DebugStop();
    }
    if (result.size() != 3) {
        DebugStop();
    }
#endif
    result[0] = x1[1] * x2[2] - x2[1] * x1[2];
    result[1] = x1[2] * x2[0] - x2[2] * x1[0];
    result[2] = x1[0] * x2[1] - x2[0] * x1[1];
}